

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_string_charAt(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValueUnion JVar1;
  uint16_t c;
  int iVar2;
  JSValueUnion JVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  JSRefCountHeader *p;
  JSValue v;
  JSValue JVar7;
  int idx;
  int local_24;
  
  v = JS_ToStringCheckObject(ctx,this_val);
  JVar3 = v.u;
  uVar6 = (uint)v.tag;
  JVar7 = v;
  if (uVar6 != 6) {
    JVar7 = *argv;
    if (0xfffffff4 < (uint)argv->tag) {
      *(int *)(argv->u).ptr = *(argv->u).ptr + 1;
    }
    iVar2 = JS_ToInt32SatFree(ctx,&local_24,JVar7);
    if (iVar2 == 0) {
      lVar4 = (long)local_24;
      if ((lVar4 < 0) ||
         (uVar5 = (uint)*(undefined8 *)((long)JVar3.ptr + 4), (int)(uVar5 & 0x7fffffff) <= local_24)
         ) {
        JVar1 = (JSValueUnion)((JSValueUnion *)(ctx->rt->atom_array + 0x2f))->ptr;
        *(int *)JVar1.ptr = *JVar1.ptr + 1;
        JVar7.tag = -7;
        JVar7.u.ptr = JVar1.ptr;
      }
      else {
        if ((int)uVar5 < 0) {
          c = *(uint16_t *)((long)JVar3.ptr + lVar4 * 2 + 0x10);
        }
        else {
          c = (uint16_t)*(byte *)((long)JVar3.ptr + lVar4 + 0x10);
        }
        JVar7 = js_new_string_char(ctx,c);
      }
      if ((0xfffffff4 < uVar6) && (iVar2 = *JVar3.ptr, *(int *)JVar3.ptr = iVar2 + -1, iVar2 < 2)) {
        __JS_FreeValueRT(ctx->rt,v);
      }
    }
    else {
      if ((0xfffffff4 < uVar6) && (iVar2 = *JVar3.ptr, *(int *)JVar3.ptr = iVar2 + -1, iVar2 < 2)) {
        __JS_FreeValueRT(ctx->rt,v);
      }
      JVar7 = (JSValue)(ZEXT816(6) << 0x40);
    }
  }
  return JVar7;
}

Assistant:

static JSValue js_string_charAt(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv)
{
    JSValue val, ret;
    JSString *p;
    int idx, c;

    val = JS_ToStringCheckObject(ctx, this_val);
    if (JS_IsException(val))
        return val;
    p = JS_VALUE_GET_STRING(val);
    if (JS_ToInt32Sat(ctx, &idx, argv[0])) {
        JS_FreeValue(ctx, val);
        return JS_EXCEPTION;
    }
    if (idx < 0 || idx >= p->len) {
        ret = js_new_string8(ctx, NULL, 0);
    } else {
        if (p->is_wide_char)
            c = p->u.str16[idx];
        else
            c = p->u.str8[idx];
        ret = js_new_string_char(ctx, c);
    }
    JS_FreeValue(ctx, val);
    return ret;
}